

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O1

int __thiscall MovDemuxer::mov_read_glbl(MovDemuxer *this,MOVAtom atom)

{
  Track *pTVar1;
  ParsedTrackPrivData *pPVar2;
  uint8_t *binary;
  int iVar3;
  
  iVar3 = -1;
  if ((ulong)atom.size < 0x40000001) {
    pTVar1 = (this->super_IOContextDemuxer).tracks
             [(long)(this->super_IOContextDemuxer).num_tracks + -1];
    if (pTVar1->codec_priv != (uchar *)0x0) {
      operator_delete__(pTVar1->codec_priv);
    }
    binary = (uint8_t *)operator_new__(atom.size);
    pTVar1->codec_priv = binary;
    pTVar1->codec_priv_size = (uint)atom.size;
    IOContextDemuxer::get_buffer(&this->super_IOContextDemuxer,binary,(uint)atom.size);
    pPVar2 = pTVar1->parsed_priv_data;
    iVar3 = 0;
    if (pPVar2 != (ParsedTrackPrivData *)0x0) {
      (*pPVar2->_vptr_ParsedTrackPrivData[2])
                (pPVar2,pTVar1->codec_priv,(ulong)(uint)pTVar1->codec_priv_size);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int MovDemuxer::mov_read_glbl(MOVAtom atom)
{
    if (static_cast<uint64_t>(atom.size) > (1 << 30))
        return -1;
    Track* st = tracks[num_tracks - 1];
    delete[] st->codec_priv;
    st->codec_priv = new unsigned char[atom.size];
    st->codec_priv_size = static_cast<int>(atom.size);
    get_buffer(st->codec_priv, static_cast<int>(atom.size));
    if (st->parsed_priv_data)
        st->parsed_priv_data->setPrivData(st->codec_priv, st->codec_priv_size);
    return 0;
}